

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

MoveData * __thiscall
Rml::ElementHandleTargetData::GetMoveData
          (MoveData *__return_storage_ptr__,ElementHandleTargetData *this,Vector2f *drag_delta_min,
          Vector2f *drag_delta_max)

{
  value_type_conflict2 vVar1;
  LengthPercentageAuto LVar2;
  const_reference pvVar3;
  Array<float,_NUM_EDGES> *this_00;
  float fVar4;
  float fVar5;
  Vector2f VVar6;
  bool local_e1;
  MoveData *data;
  Vector2<float> local_b0;
  Vector2<float> local_a8;
  Vector2f local_a0;
  Vector2f local_90;
  Vector2<float> local_88;
  Vector2<float> local_80;
  Vector2f local_78;
  Vector2f local_70;
  Vector2f local_68;
  Vector2f local_60;
  Vector2f distance_to_bottom_right;
  Vector2f distance_to_top_left;
  Type local_48;
  Type local_40;
  Type local_38;
  Vector2f local_30;
  Vector2f local_28;
  Vector2f *local_20;
  Vector2f *drag_delta_max_local;
  Vector2f *drag_delta_min_local;
  ElementHandleTargetData *this_local;
  
  local_20 = drag_delta_max;
  drag_delta_max_local = drag_delta_min;
  drag_delta_min_local = (Vector2f *)this;
  Vector2<float>::Vector2(&__return_storage_ptr__->original_position_top_left);
  Vector2<float>::Vector2(&__return_storage_ptr__->original_position_bottom_right);
  Vector2<bool>::Vector2(&__return_storage_ptr__->top_left);
  Vector2<bool>::Vector2(&__return_storage_ptr__->bottom_right);
  fVar4 = GetPositionLeft(this);
  fVar5 = GetPositionTop(this);
  Vector2<float>::Vector2(&local_28,fVar4,fVar5);
  __return_storage_ptr__->original_position_top_left = local_28;
  fVar4 = GetPositionRight(this);
  fVar5 = GetPositionBottom(this);
  Vector2<float>::Vector2(&local_30,fVar4,fVar5);
  __return_storage_ptr__->original_position_bottom_right = local_30;
  LVar2 = Style::ComputedValues::right(this->computed);
  local_38 = LVar2.type;
  (__return_storage_ptr__->bottom_right).x = local_38 != Auto;
  LVar2 = Style::ComputedValues::bottom(this->computed);
  local_40 = LVar2.type;
  (__return_storage_ptr__->bottom_right).y = local_40 != Auto;
  data._7_1_ = true;
  if (((__return_storage_ptr__->bottom_right).x & 1U) != 0) {
    LVar2 = Style::ComputedValues::left(this->computed);
    local_48 = LVar2.type;
    data._7_1_ = local_48 != Auto;
  }
  (__return_storage_ptr__->top_left).x = data._7_1_;
  local_e1 = true;
  if (((__return_storage_ptr__->bottom_right).y & 1U) != 0) {
    LVar2 = Style::ComputedValues::top(this->computed);
    distance_to_top_left.x._0_1_ = LVar2.type;
    local_e1 = distance_to_top_left.x._0_1_ != Auto;
  }
  (__return_storage_ptr__->top_left).y = local_e1;
  local_68 = DistanceToTopLeft(this);
  distance_to_bottom_right = local_68;
  local_60 = DistanceToBottomRight(this,local_68);
  local_78 = *drag_delta_max_local;
  this_00 = &this->resolved_edge_margin;
  pvVar3 = ::std::array<float,_4UL>::operator[](this_00,3);
  fVar4 = *pvVar3;
  pvVar3 = ::std::array<float,_4UL>::operator[](this_00,0);
  Vector2<float>::Vector2(&local_88,fVar4,*pvVar3);
  local_90 = distance_to_bottom_right;
  local_80 = Vector2<float>::operator-(&local_88,distance_to_bottom_right);
  local_70 = Math::Max<Rml::Vector2<float>>(local_78,local_80);
  *drag_delta_max_local = local_70;
  local_a0 = *local_20;
  pvVar3 = ::std::array<float,_4UL>::operator[](this_00,1);
  vVar1 = *pvVar3;
  pvVar3 = ::std::array<float,_4UL>::operator[](this_00,2);
  Vector2<float>::Vector2(&local_b0,-vVar1,-*pvVar3);
  local_a8 = Vector2<float>::operator+(&local_b0,local_60);
  VVar6 = Math::Min<Rml::Vector2<float>>(local_a0,local_a8);
  *local_20 = VVar6;
  return __return_storage_ptr__;
}

Assistant:

MoveData GetMoveData(Vector2f& drag_delta_min, Vector2f& drag_delta_max) const
	{
		using namespace Style;
		MoveData data = {};

		data.original_position_top_left = {GetPositionLeft(), GetPositionTop()};
		data.original_position_bottom_right = {GetPositionRight(), GetPositionBottom()};

		data.bottom_right.x = (computed.right().type != Right::Auto);
		data.bottom_right.y = (computed.bottom().type != Bottom::Auto);
		data.top_left.x = (!data.bottom_right.x || computed.left().type != Left::Auto);
		data.top_left.y = (!data.bottom_right.y || computed.top().type != Top::Auto);

		const Vector2f distance_to_top_left = DistanceToTopLeft();
		const Vector2f distance_to_bottom_right = DistanceToBottomRight(distance_to_top_left);

		drag_delta_min = Math::Max(drag_delta_min, Vector2f{resolved_edge_margin[LEFT], resolved_edge_margin[TOP]} - distance_to_top_left);
		drag_delta_max = Math::Min(drag_delta_max, Vector2f{-resolved_edge_margin[RIGHT], -resolved_edge_margin[BOTTOM]} + distance_to_bottom_right);

		return data;
	}